

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

int __thiscall
re2::NFA::Step(NFA *this,Threadq *runq,Threadq *nextq,int c,StringPiece *context,char *p)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Thread *pTVar5;
  Inst *pIVar6;
  char **ppcVar7;
  Inst *pIVar8;
  char *pcVar9;
  char **ppcVar10;
  ostream *poVar11;
  IndexValue *pIVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  IndexValue *pIVar16;
  LogMessage local_1b0;
  
  nextq->size_ = 0;
  if (runq->size_ != 0) {
    pIVar12 = (runq->dense_).ptr_._M_t.
              super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
              _M_head_impl;
    pcVar9 = p + -1;
    pIVar16 = pIVar12;
    do {
      pTVar5 = pIVar16->value_;
      if (pTVar5 != (Thread *)0x0) {
        bVar1 = this->longest_;
        if (((bVar1 != true) || (this->matched_ != true)) || (*pTVar5->capture <= *this->match_)) {
          iVar2 = pIVar16->index_;
          pIVar6 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                   ((long)&(this->prog_->inst_).ptr_._M_t.
                           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                   + 8))->_M_head_impl;
          uVar3 = pIVar6[iVar2].out_opcode_;
          uVar13 = uVar3 & 7;
          if (uVar13 == 1) {
            if (pIVar16 == pIVar12) {
              uVar13 = pIVar6[uVar3 >> 4].out_opcode_ & 7;
              if (uVar13 == 6) {
                uVar13 = pIVar6[pIVar6[uVar3 >> 4].out_opcode_ >> 4].out_opcode_ & 7;
              }
              if ((uVar13 == 2) || (bVar1 != false)) {
                iVar4 = this->ncapture_;
                if (0 < (long)iVar4) {
                  ppcVar10 = this->match_;
                  ppcVar7 = pTVar5->capture;
                  uVar15 = 0;
                  do {
                    ppcVar10[uVar15] = ppcVar7[uVar15];
                    ppcVar10[uVar15 + 1] = ppcVar7[uVar15 + 1];
                    uVar15 = uVar15 + 2;
                  } while (uVar15 < (ulong)(long)iVar4);
                }
                this->matched_ = true;
                iVar4 = (pTVar5->field_0).ref;
                (pTVar5->field_0).ref = iVar4 + -1;
                if (iVar4 < 2) {
                  pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                  this->free_threads_ = pTVar5;
                }
                while (pIVar12 = pIVar16 + 1,
                      pIVar12 !=
                      (runq->dense_).ptr_._M_t.
                      super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                      .
                      super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>
                      ._M_head_impl + runq->size_) {
                  pTVar5 = pIVar16[1].value_;
                  pIVar16 = pIVar12;
                  if ((pTVar5 != (Thread *)0x0) &&
                     (iVar4 = (pTVar5->field_0).ref, (pTVar5->field_0).ref = iVar4 + -1, iVar4 < 2))
                  {
                    pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                    this->free_threads_ = pTVar5;
                  }
                }
                runq->size_ = 0;
                uVar13 = pIVar6[iVar2].out_opcode_ >> 4;
                pIVar8 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                         ((long)&(this->prog_->inst_).ptr_._M_t.
                                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                         + 8))->_M_head_impl;
                uVar3 = pIVar8[uVar13].out_opcode_;
                uVar14 = uVar3 & 7;
                if (uVar14 != 2) {
                  if (uVar14 != 6) {
                    return uVar13;
                  }
                  if ((pIVar8[uVar3 >> 4].out_opcode_ & 7) != 2) {
                    return uVar13;
                  }
                }
                return pIVar6[iVar2].field_1.cap_;
              }
            }
          }
          else if (uVar13 == 2) {
            AddToThreadq(this,nextq,uVar3 >> 4,c,context,p,pTVar5);
          }
          else if (uVar13 == 5) {
            if ((p != (char *)0x0) && ((this->endmatch_ != true || (pcVar9 == this->etext_)))) {
              if (bVar1 == false) {
                ppcVar10 = this->match_;
                iVar2 = this->ncapture_;
                if (0 < (long)iVar2) {
                  ppcVar7 = pTVar5->capture;
                  uVar15 = 0;
                  do {
                    ppcVar10[uVar15] = ppcVar7[uVar15];
                    ppcVar10[uVar15 + 1] = ppcVar7[uVar15 + 1];
                    uVar15 = uVar15 + 2;
                  } while (uVar15 < (ulong)(long)iVar2);
                  ppcVar10 = this->match_;
                }
                ppcVar10[1] = pcVar9;
                this->matched_ = true;
                iVar2 = (pTVar5->field_0).ref;
                (pTVar5->field_0).ref = iVar2 + -1;
                if (iVar2 < 2) {
                  pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                  this->free_threads_ = pTVar5;
                }
                while (pIVar12 = pIVar16 + 1,
                      pIVar12 !=
                      (runq->dense_).ptr_._M_t.
                      super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                      .
                      super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>
                      ._M_head_impl + runq->size_) {
                  pTVar5 = pIVar16[1].value_;
                  pIVar16 = pIVar12;
                  if ((pTVar5 != (Thread *)0x0) &&
                     (iVar2 = (pTVar5->field_0).ref, (pTVar5->field_0).ref = iVar2 + -1, iVar2 < 2))
                  {
                    pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                    this->free_threads_ = pTVar5;
                  }
                }
                break;
              }
              ppcVar10 = this->match_;
              ppcVar7 = pTVar5->capture;
              if (((this->matched_ != true) || (*ppcVar7 < *ppcVar10)) ||
                 ((*ppcVar7 == *ppcVar10 && (ppcVar10[1] < pcVar9)))) {
                iVar2 = this->ncapture_;
                if (0 < (long)iVar2) {
                  uVar15 = 0;
                  do {
                    ppcVar10[uVar15] = ppcVar7[uVar15];
                    ppcVar10[uVar15 + 1] = ppcVar7[uVar15 + 1];
                    uVar15 = uVar15 + 2;
                  } while (uVar15 < (ulong)(long)iVar2);
                  ppcVar10 = this->match_;
                }
                ppcVar10[1] = pcVar9;
                this->matched_ = true;
              }
            }
          }
          else {
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                       ,0x167);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0.str_,"Unhandled ",10);
            poVar11 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)&local_1b0.str_,pIVar6[iVar2].out_opcode_ & 7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," in step",8);
            LogMessage::~LogMessage(&local_1b0);
          }
        }
        iVar2 = (pTVar5->field_0).ref;
        (pTVar5->field_0).ref = iVar2 + -1;
        if (iVar2 < 2) {
          pTVar5->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
          this->free_threads_ = pTVar5;
        }
      }
      pIVar16 = pIVar16 + 1;
      pIVar12 = (runq->dense_).ptr_._M_t.
                super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                ._M_t.
                super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
                _M_head_impl;
    } while (pIVar16 != pIVar12 + runq->size_);
  }
  runq->size_ = 0;
  return 0;
}

Assistant:

int NFA::Step(Threadq* runq, Threadq* nextq, int c, const StringPiece& context,
              const char* p) {
  nextq->clear();

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    Thread* t = i->value();
    if (t == NULL)
      continue;

    if (longest_) {
      // Can skip any threads started after our current best match.
      if (matched_ && match_[0] < t->capture[0]) {
        Decref(t);
        continue;
      }
    }

    int id = i->index();
    Prog::Inst* ip = prog_->inst(id);

    switch (ip->opcode()) {
      default:
        // Should only see the values handled below.
        LOG(DFATAL) << "Unhandled " << ip->opcode() << " in step";
        break;

      case kInstByteRange:
        AddToThreadq(nextq, ip->out(), c, context, p, t);
        break;

      case kInstAltMatch:
        if (i != runq->begin())
          break;
        // The match is ours if we want it.
        if (ip->greedy(prog_) || longest_) {
          CopyCapture(match_, t->capture);
          matched_ = true;

          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->value());
          runq->clear();
          if (ip->greedy(prog_))
            return ip->out1();
          return ip->out();
        }
        break;

      case kInstMatch: {
        // Avoid invoking undefined behavior when p happens
        // to be null - and p-1 would be meaningless anyway.
        if (p == NULL)
          break;

        if (endmatch_ && p-1 != etext_)
          break;

        if (longest_) {
          // Leftmost-longest mode: save this match only if
          // it is either farther to the left or at the same
          // point but longer than an existing match.
          if (!matched_ || t->capture[0] < match_[0] ||
              (t->capture[0] == match_[0] && p-1 > match_[1])) {
            CopyCapture(match_, t->capture);
            match_[1] = p-1;
            matched_ = true;
          }
        } else {
          // Leftmost-biased mode: this match is by definition
          // better than what we've already found (see next line).
          CopyCapture(match_, t->capture);
          match_[1] = p-1;
          matched_ = true;

          // Cut off the threads that can only find matches
          // worse than the one we just found: don't run the
          // rest of the current Threadq.
          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->value());
          runq->clear();
          return 0;
        }
        break;
      }
    }
    Decref(t);
  }
  runq->clear();
  return 0;
}